

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobVerificationManager.cxx
# Opt level: O0

void __thiscall
cmGlobVerificationManager::AddCacheEntry
          (cmGlobVerificationManager *this,bool recurse,bool listDirectories,bool followSymlinks,
          string *relative,string *expression,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *variable,cmListFileBacktrace *backtrace,cmMessenger *messenger)

{
  bool bVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  type *ptVar4;
  type *bt_00;
  string local_280;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>
  *local_260;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>
  *bt;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
  *__range3;
  ostringstream message;
  CacheEntryValue *value;
  string local_b0;
  string local_90;
  undefined1 local_70 [8];
  CacheEntryKey key;
  string *expression_local;
  string *relative_local;
  bool followSymlinks_local;
  bool listDirectories_local;
  bool recurse_local;
  cmGlobVerificationManager *this_local;
  
  key.Expression.field_2._8_8_ = expression;
  std::__cxx11::string::string((string *)&local_90,(string *)relative);
  std::__cxx11::string::string((string *)&local_b0,(string *)key.Expression.field_2._8_8_);
  CacheEntryKey::CacheEntryKey
            ((CacheEntryKey *)local_70,recurse,listDirectories,followSymlinks,&local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  pmVar2 = std::
           map<cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue,_std::less<cmGlobVerificationManager::CacheEntryKey>,_std::allocator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>_>
           ::operator[](&this->Cache,(key_type *)local_70);
  if ((pmVar2->Initialized & 1U) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&pmVar2->Files,files);
    pmVar2->Initialized = true;
    std::
    vector<std::pair<std::__cxx11::string,cmListFileBacktrace>,std::allocator<std::pair<std::__cxx11::string,cmListFileBacktrace>>>
    ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace_const&>
              ((vector<std::pair<std::__cxx11::string,cmListFileBacktrace>,std::allocator<std::pair<std::__cxx11::string,cmListFileBacktrace>>>
                *)&pmVar2->Backtraces,variable,backtrace);
  }
  else if (((pmVar2->Initialized & 1U) == 0) ||
          (bVar1 = std::operator!=(&pmVar2->Files,files), !bVar1)) {
    std::
    vector<std::pair<std::__cxx11::string,cmListFileBacktrace>,std::allocator<std::pair<std::__cxx11::string,cmListFileBacktrace>>>
    ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace_const&>
              ((vector<std::pair<std::__cxx11::string,cmListFileBacktrace>,std::allocator<std::pair<std::__cxx11::string,cmListFileBacktrace>>>
                *)&pmVar2->Backtraces,variable,backtrace);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range3);
    std::ostream::operator<<(&__range3,std::boolalpha);
    std::operator<<((ostream *)&__range3,"The glob expression\n ");
    CacheEntryKey::PrintGlobCommand((CacheEntryKey *)local_70,(ostream *)&__range3,variable);
    std::operator<<((ostream *)&__range3,
                    "\nwas already present in the glob cache but the directory contents have changed during the configuration run.\n"
                   );
    std::operator<<((ostream *)&__range3,"Matching glob expressions:");
    __end3 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
             ::begin(&pmVar2->Backtraces);
    bt = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
            ::end(&pmVar2->Backtraces);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>_>
                                       *)&bt), bVar1) {
      local_260 = __gnu_cxx::
                  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>_>
                  ::operator*(&__end3);
      poVar3 = std::operator<<((ostream *)&__range3,"\n  ");
      ptVar4 = std::get<0ul,std::__cxx11::string,cmListFileBacktrace>(local_260);
      std::operator<<(poVar3,(string *)ptVar4);
      bt_00 = std::get<1ul,std::__cxx11::string,cmListFileBacktrace>(local_260);
      cmMessenger::PrintBacktraceTitle(messenger,(ostream *)&__range3,bt_00);
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>_>
      ::operator++(&__end3);
    }
    std::__cxx11::ostringstream::str();
    cmMessenger::IssueMessage(messenger,FATAL_ERROR,&local_280,backtrace);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range3);
  }
  CacheEntryKey::~CacheEntryKey((CacheEntryKey *)local_70);
  return;
}

Assistant:

void cmGlobVerificationManager::AddCacheEntry(
  const bool recurse, const bool listDirectories, const bool followSymlinks,
  const std::string& relative, const std::string& expression,
  const std::vector<std::string>& files, const std::string& variable,
  const cmListFileBacktrace& backtrace, cmMessenger* messenger)
{
  CacheEntryKey key = CacheEntryKey(recurse, listDirectories, followSymlinks,
                                    relative, expression);
  CacheEntryValue& value = this->Cache[key];
  if (!value.Initialized) {
    value.Files = files;
    value.Initialized = true;
    value.Backtraces.emplace_back(variable, backtrace);
  } else if (value.Initialized && value.Files != files) {
    std::ostringstream message;
    message << std::boolalpha;
    message << "The glob expression\n ";
    key.PrintGlobCommand(message, variable);
    message << "\nwas already present in the glob cache but the directory "
               "contents have changed during the configuration run.\n";
    message << "Matching glob expressions:";
    for (auto const& bt : value.Backtraces) {
      message << "\n  " << std::get<0>(bt);
      messenger->PrintBacktraceTitle(message, std::get<1>(bt));
    }
    messenger->IssueMessage(MessageType::FATAL_ERROR, message.str(),
                            backtrace);
  } else {
    value.Backtraces.emplace_back(variable, backtrace);
  }
}